

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_9bdda5::HandleAsciiCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *name;
  char *__nptr;
  int iVar1;
  pointer pbVar2;
  pointer pbVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  string_view value;
  string output;
  string error;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar2 - (long)pbVar3) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"No output variable specified",(allocator<char> *)&local_60);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_90);
    bVar6 = false;
  }
  else {
    name = pbVar2 + -1;
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    lVar5 = 0x28;
    for (uVar4 = 1; bVar6 = ((long)pbVar2 - (long)pbVar3 >> 5) - 1U <= uVar4, !bVar6;
        uVar4 = uVar4 + 1) {
      __nptr = *(char **)((long)pbVar3 + lVar5 + -8);
      iVar1 = atoi(__nptr);
      if (0xfe < iVar1 - 1U) {
        local_90.View_._M_len = 0x14;
        local_90.View_._M_str = "Character with code ";
        local_60.View_._M_len = *(size_t *)((long)&(pbVar3->_M_dataplus)._M_p + lVar5);
        local_60.View_._M_str = __nptr;
        cmStrCat<char[17]>(&error,&local_90,&local_60,(char (*) [17])0x5b2b8f);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)&error);
        goto LAB_00273f13;
      }
      std::__cxx11::string::push_back((char)&output);
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar5 = lVar5 + 0x20;
    }
    value._M_str = output._M_dataplus._M_p;
    value._M_len = output._M_string_length;
    cmMakefile::AddDefinition(status->Makefile,name,value);
LAB_00273f13:
    std::__cxx11::string::~string((string *)&output);
  }
  return bVar6;
}

Assistant:

bool HandleAsciiCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("No output variable specified");
    return false;
  }
  std::string::size_type cc;
  std::string const& outvar = args.back();
  std::string output;
  for (cc = 1; cc < args.size() - 1; cc++) {
    int ch = atoi(args[cc].c_str());
    if (ch > 0 && ch < 256) {
      output += static_cast<char>(ch);
    } else {
      std::string error =
        cmStrCat("Character with code ", args[cc], " does not exist.");
      status.SetError(error);
      return false;
    }
  }
  // Store the output in the provided variable.
  status.GetMakefile().AddDefinition(outvar, output);
  return true;
}